

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O0

bool __thiscall bidirectional::BiDirectional::checkBounds(BiDirectional *this,Directions *direction)

{
  double dVar1;
  pointer pPVar2;
  int *piVar3;
  element_type *peVar4;
  reference pvVar5;
  int *in_RSI;
  long in_RDI;
  int *c_res;
  Search *search_ptr;
  undefined8 in_stack_ffffffffffffffc0;
  value_type vVar6;
  BiDirectional *in_stack_ffffffffffffffc8;
  
  getSearchPtr(in_stack_ffffffffffffffc8,(Directions)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  pPVar2 = std::unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>::
           operator->((unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                       *)0x245d07);
  piVar3 = &pPVar2->critical_res;
  if (*in_RSI == 0) {
    peVar4 = std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x245d28);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&peVar4->resource_consumption,(long)*piVar3);
    vVar6 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)*piVar3);
    if (vVar6 <= *pvVar5) {
      return false;
    }
  }
  if (*in_RSI == 1) {
    peVar4 = std::__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x245d88);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&peVar4->resource_consumption,(long)*piVar3);
    vVar6 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x80),(long)*piVar3);
    if (*pvVar5 <= vVar6 && vVar6 != *pvVar5) {
      return false;
    }
  }
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x68),(long)*piVar3);
  dVar1 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x80),(long)*piVar3);
  if ((dVar1 == *pvVar5) && (!NAN(dVar1) && !NAN(*pvVar5))) {
    pPVar2 = std::unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>::
             operator->((unique_ptr<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                         *)0x245e27);
    if (pPVar2->direction != BOTH) {
      return false;
    }
    return true;
  }
  return false;
}

Assistant:

bool BiDirectional::checkBounds(const Directions& direction) {
  // Check resource bounds
  Search*    search_ptr = getSearchPtr(direction);
  const int& c_res      = params_ptr_->critical_res;

  if ((direction == FWD &&
       search_ptr->current_label->resource_consumption[c_res] <=
           max_res_curr_[c_res]) ||
      (direction == BWD &&
       search_ptr->current_label->resource_consumption[c_res] >
           min_res_curr_[c_res]) ||
      max_res_curr_[c_res] != min_res_curr_[c_res]) {
    return false;
  }
  // only stop if search is being performed in both directions
  else if (params_ptr_->direction == BOTH) {
    return true;
  }
  return false;
}